

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembler.cpp
# Opt level: O1

Error __thiscall asmjit::Assembler::setOffset(Assembler *this,size_t offset)

{
  SectionEntry *pSVar1;
  uint8_t *puVar2;
  ulong uVar3;
  Error EVar4;
  ulong uVar5;
  
  EVar4 = (this->super_CodeEmitter)._lastError;
  if (EVar4 != 0) {
    return EVar4;
  }
  pSVar1 = this->_section;
  puVar2 = this->_bufferData;
  uVar3 = (pSVar1->_buffer)._length;
  uVar5 = (long)this->_bufferPtr - (long)puVar2;
  if (uVar5 < uVar3) {
    uVar5 = uVar3;
  }
  if (offset <= uVar5) {
    if ((pSVar1->_buffer)._length < uVar5) {
      (pSVar1->_buffer)._length = uVar5;
    }
    this->_bufferPtr = puVar2 + offset;
    return 0;
  }
  EVar4 = CodeEmitter::setLastError(&this->super_CodeEmitter,3,(char *)0x0);
  return EVar4;
}

Assistant:

Error Assembler::setOffset(size_t offset) {
  if (_lastError) return _lastError;

  size_t length = std::max(_section->getBuffer().getLength(), getOffset());
  if (ASMJIT_UNLIKELY(offset > length))
    return setLastError(DebugUtils::errored(kErrorInvalidArgument));

  // If the `Assembler` generated any code the `_bufferPtr` may be higher than
  // the section length stored in `CodeHolder` as it doesn't update it each
  // time it generates machine code. This is the same as calling `sync()`.
  if (_section->_buffer._length < length)
    _section->_buffer._length = length;

  _bufferPtr = _bufferData + offset;
  return kErrorOk;
}